

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O0

int __thiscall
FZipExploder::BuildDecoder
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          TableBuilder *values,int numvals)

{
  uchar uVar1;
  short local_2c;
  ushort local_2a;
  int iStack_28;
  unsigned_short last_bit_length;
  unsigned_short code_increment;
  unsigned_short code;
  int i;
  int numvals_local;
  TableBuilder *values_local;
  TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder_local;
  FZipExploder *this_local;
  
  qsort(values,(long)numvals,4,buildercmp);
  local_2a = 0;
  local_2c = 0;
  uVar1 = '\0';
  for (iStack_28 = numvals + -1; -1 < iStack_28; iStack_28 = iStack_28 + -1) {
    local_2a = local_2a + local_2c;
    if (values[iStack_28].Length != uVar1) {
      uVar1 = values[iStack_28].Length;
      local_2c = (short)(1 << (0x10 - uVar1 & 0x1f));
    }
    values[iStack_28].Code =
         (ushort)""[(int)(uint)local_2a >> 0xc] |
         (ushort)""[(int)((int)(uint)local_2a >> 8 & 0xf)] << 4 |
         (ushort)""[(int)((int)(uint)local_2a >> 4 & 0xf)] << 8 |
         (ushort)""[(int)(local_2a & 0xf)] << 0xc;
  }
  InitTable(this,decoder,0x100);
  for (iStack_28 = 0; iStack_28 < numvals; iStack_28 = iStack_28 + 1) {
    InsertCode(this,decoder,0,8,values[iStack_28].Code,(uint)values[iStack_28].Length,
               values[iStack_28].Value);
  }
  return 0;
}

Assistant:

int FZipExploder::BuildDecoder(TArray<HuffNode> &decoder, TableBuilder *values, int numvals)
{
	int i;

	qsort(values, numvals, sizeof(*values), buildercmp);

	// Generate the Shannon-Fano tree:
	unsigned short code = 0;
	unsigned short code_increment = 0;
	unsigned short last_bit_length = 0;
	for (i = numvals - 1; i >= 0; --i)
	{
		code += code_increment;
		if (values[i].Length != last_bit_length)
		{
			last_bit_length = values[i].Length;
			code_increment = 1 << (16 - last_bit_length);
		}
		// Reverse the order of the bits in the code before storing it.
		values[i].Code = BitReverse4[code >> 12] |
						(BitReverse4[(code >> 8) & 0xf] << 4) |
						(BitReverse4[(code >> 4) & 0xf] << 8) |
						(BitReverse4[code & 0xf] << 12);
	}

	// Insert each code into the hierarchical table. The top level is FIRST_BIT_LEN bits,
	// and the other levels are REST_BIT_LEN bits. If a code does not completely fill
	// a level, every permutation for the remaining bits is filled in to
	// match this one.
	InitTable(decoder, 1 << FIRST_BIT_LEN);		// Set up the top level.
	for (i = 0; i < numvals; ++i)
	{
		InsertCode(decoder, 0, FIRST_BIT_LEN, values[i].Code, values[i].Length, values[i].Value);
	}
	return 0;
}